

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

Error __thiscall
llvm::handleErrorImpl<llvm::errorToErrorCode(llvm::Error)::__0>
          (llvm *this,
          unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload,
          anon_class_8_1_3fcf615c *Handler)

{
  ErrorInfoBase *pEVar1;
  error_code *peVar2;
  int iVar3;
  error_category *extraout_RDX;
  
  pEVar1 = (Payload->_M_t).
           super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
           super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
  iVar3 = (*pEVar1->_vptr_ErrorInfoBase[6])(pEVar1,&ErrorInfoBase::ID);
  pEVar1 = (Payload->_M_t).
           super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
           super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
  if ((char)iVar3 == '\0') {
    (Payload->_M_t).
    super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
    super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl = (ErrorInfoBase *)0x0;
    *(ulong *)this = (ulong)pEVar1 | 1;
  }
  else {
    (Payload->_M_t).
    super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
    super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl = (ErrorInfoBase *)0x0;
    iVar3 = (*pEVar1->_vptr_ErrorInfoBase[6])(pEVar1,&ErrorInfoBase::ID);
    if ((char)iVar3 == '\0') {
      __assert_fail("appliesTo(*E) && \"Applying incorrect handler\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Error.h"
                    ,0x310,
                    "static Error llvm::ErrorHandlerTraits<void (&)(llvm::ErrorInfoBase &)>::apply(HandlerT &&, std::unique_ptr<ErrorInfoBase>) [HandlerT = void (&)(llvm::ErrorInfoBase &), HandlerT = (lambda at /workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Error.cpp:86:35)]"
                   );
    }
    iVar3 = (*pEVar1->_vptr_ErrorInfoBase[4])(pEVar1);
    peVar2 = Handler->EC;
    peVar2->_M_value = iVar3;
    peVar2->_M_cat = extraout_RDX;
    *(undefined8 *)this = 1;
    (*pEVar1->_vptr_ErrorInfoBase[1])(pEVar1);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error handleErrorImpl(std::unique_ptr<ErrorInfoBase> Payload,
                      HandlerT &&Handler, HandlerTs &&... Handlers) {
  if (ErrorHandlerTraits<HandlerT>::appliesTo(*Payload))
    return ErrorHandlerTraits<HandlerT>::apply(std::forward<HandlerT>(Handler),
                                               std::move(Payload));
  return handleErrorImpl(std::move(Payload),
                         std::forward<HandlerTs>(Handlers)...);
}